

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_soa.h
# Opt level: O2

GridSOA * embree::sse2::GridSOA::create<embree::BVHN<4>::Allocator_const>
                    (SubdivPatch1Base *patches,uint time_steps,uint x0,uint x1,uint y0,uint y1,
                    Scene *scene,Allocator *alloc,BBox3fa *bounds_o)

{
  FastAllocator *this;
  size_t *psVar1;
  atomic<unsigned_long> *paVar2;
  BVHN<4> *pBVar3;
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> this_00;
  MutexSys *pMVar4;
  MutexSys MVar5;
  size_t sVar6;
  long *plVar7;
  ThreadLocal2 *this_01;
  size_t sVar8;
  ulong uVar9;
  uint uVar10;
  size_t sVar11;
  uint uVar12;
  ulong uVar13;
  GridSOA *this_02;
  Lock<embree::MutexSys> lock;
  Lock<embree::MutexSys> local_78;
  GridRange range;
  MutexSys local_50;
  ulong local_48;
  __uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
  local_40;
  range<int> local_38;
  
  uVar9 = (ulong)time_steps;
  uVar12 = x1 - x0;
  range.u_start = 0;
  range.v_start = 0;
  uVar10 = y1 - y0;
  range.u_end = uVar12;
  range.v_end = uVar10;
  if (time_steps == 1) {
    sVar6 = getBVHBytes(&range,0x80,0);
  }
  else {
    sVar11 = getBVHBytes(&range,0xe0,0);
    local_38._begin = 0;
    local_38._end = time_steps - 1;
    sVar6 = getTemporalBVHBytes(&local_38,0x100);
    sVar6 = sVar6 + sVar11 * (time_steps - 1);
  }
  plVar7 = (long *)__tls_get_addr(&PTR_021f8d38);
  this_01 = (ThreadLocal2 *)*plVar7;
  if (this_01 == (ThreadLocal2 *)0x0) {
    this_01 = (ThreadLocal2 *)FastAllocator::ThreadLocal2::operator_new(0xc0);
    MutexSys::MutexSys((MutexSys *)this_01);
    (this_01->alloc)._M_b._M_p = (__pointer_type)0x0;
    (this_01->alloc0).parent = this_01;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc1).parent = this_01;
    (this_01->alloc1).ptr = (char *)0x0;
    (this_01->alloc1).cur = 0;
    (this_01->alloc1).end = 0;
    (this_01->alloc1).allocBlockSize = 0;
    (this_01->alloc1).bytesUsed = 0;
    (this_01->alloc1).bytesWasted = 0;
    *plVar7 = (long)this_01;
    lock.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    lock.locked = true;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    local_78.mutex = (MutexSys *)this_01;
    std::
    vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
    ::
    emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
              ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                *)FastAllocator::s_thread_local_allocators,
               (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                *)&local_78);
    std::
    unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
    ::~unique_ptr((unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                   *)&local_78);
    Lock<embree::MutexSys>::~Lock(&lock);
  }
  sVar11 = (ulong)(uVar10 + 1) * (ulong)(uVar12 + 1) * 0x10;
  local_50.mutex = (void *)(sVar6 + (sVar11 + 8) * uVar9 + 0x30);
  pBVar3 = alloc->bvh;
  this = &pBVar3->alloc;
  this_00._M_head_impl = (this_01->alloc0).parent;
  local_48 = uVar9;
  if (this != ((this_00._M_head_impl)->alloc)._M_b._M_p) {
    local_78.locked = true;
    local_78.mutex = &(this_00._M_head_impl)->mutex;
    MutexSys::lock(&(this_00._M_head_impl)->mutex);
    if (((this_00._M_head_impl)->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar2 = &(((this_00._M_head_impl)->alloc)._M_b._M_p)->bytesUsed;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           ((this_00._M_head_impl)->alloc1).bytesUsed + ((this_00._M_head_impl)->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar2 = &(((this_00._M_head_impl)->alloc)._M_b._M_p)->bytesFree;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           ((((this_00._M_head_impl)->alloc0).end + ((this_00._M_head_impl)->alloc1).end) -
           (((this_00._M_head_impl)->alloc0).cur + ((this_00._M_head_impl)->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar2 = &(((this_00._M_head_impl)->alloc)._M_b._M_p)->bytesWasted;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           ((this_00._M_head_impl)->alloc1).bytesWasted +
           ((this_00._M_head_impl)->alloc0).bytesWasted;
      UNLOCK();
    }
    ((this_00._M_head_impl)->alloc0).bytesUsed = 0;
    ((this_00._M_head_impl)->alloc0).bytesWasted = 0;
    ((this_00._M_head_impl)->alloc0).end = 0;
    ((this_00._M_head_impl)->alloc0).allocBlockSize = 0;
    ((this_00._M_head_impl)->alloc0).ptr = (char *)0x0;
    ((this_00._M_head_impl)->alloc0).cur = 0;
    ((this_00._M_head_impl)->alloc0).allocBlockSize = (pBVar3->alloc).defaultBlockSize;
    ((this_00._M_head_impl)->alloc1).ptr = (char *)0x0;
    ((this_00._M_head_impl)->alloc1).cur = 0;
    ((this_00._M_head_impl)->alloc1).end = 0;
    ((this_00._M_head_impl)->alloc1).allocBlockSize = 0;
    ((this_00._M_head_impl)->alloc1).bytesUsed = 0;
    ((this_00._M_head_impl)->alloc1).bytesWasted = 0;
    ((this_00._M_head_impl)->alloc1).allocBlockSize = (pBVar3->alloc).defaultBlockSize;
    LOCK();
    ((this_00._M_head_impl)->alloc)._M_b._M_p = this;
    UNLOCK();
    lock.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    lock.locked = true;
    local_40._M_t.
    super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
    .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl =
         (tuple<embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
          )(tuple<embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
            )this_00._M_head_impl;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&(pBVar3->alloc).thread_local_allocators,(value_type *)&local_40);
    Lock<embree::MutexSys>::~Lock(&lock);
    Lock<embree::MutexSys>::~Lock(&local_78);
  }
  MVar5.mutex = local_50.mutex;
  psVar1 = &(this_01->alloc0).bytesUsed;
  *psVar1 = (long)local_50.mutex + *psVar1;
  sVar8 = (this_01->alloc0).cur;
  uVar9 = (ulong)(-(int)sVar8 & 0xf);
  uVar13 = (long)local_50.mutex + uVar9 + sVar8;
  (this_01->alloc0).cur = uVar13;
  if ((this_01->alloc0).end < uVar13) {
    (this_01->alloc0).cur = sVar8;
    pMVar4 = (MutexSys *)(this_01->alloc0).allocBlockSize;
    if ((MutexSys *)((long)local_50.mutex * 4) < pMVar4 ||
        (long)local_50.mutex * 4 - (long)pMVar4 == 0) {
      lock.mutex = pMVar4;
      this_02 = (GridSOA *)FastAllocator::malloc(this,(size_t)&lock);
      (this_01->alloc0).ptr = (char *)this_02;
      sVar8 = ((this_01->alloc0).end - (this_01->alloc0).cur) + (this_01->alloc0).bytesWasted;
      (this_01->alloc0).bytesWasted = sVar8;
      (this_01->alloc0).end = (size_t)lock.mutex;
      (this_01->alloc0).cur = (size_t)MVar5.mutex;
      if (lock.mutex < MVar5.mutex) {
        (this_01->alloc0).cur = 0;
        lock.mutex = (MutexSys *)(this_01->alloc0).allocBlockSize;
        this_02 = (GridSOA *)FastAllocator::malloc(this,(size_t)&lock);
        (this_01->alloc0).ptr = (char *)this_02;
        sVar8 = ((this_01->alloc0).end - (this_01->alloc0).cur) + (this_01->alloc0).bytesWasted;
        (this_01->alloc0).bytesWasted = sVar8;
        (this_01->alloc0).end = (size_t)lock.mutex;
        (this_01->alloc0).cur = (size_t)MVar5.mutex;
        if (lock.mutex < MVar5.mutex) {
          (this_01->alloc0).cur = 0;
          this_02 = (GridSOA *)0x0;
          goto LAB_005f77a1;
        }
      }
      (this_01->alloc0).bytesWasted = sVar8;
    }
    else {
      this_02 = (GridSOA *)FastAllocator::malloc(this,(size_t)&local_50);
    }
  }
  else {
    psVar1 = &(this_01->alloc0).bytesWasted;
    *psVar1 = *psVar1 + uVar9;
    this_02 = (GridSOA *)((this_01->alloc0).ptr + (uVar13 - (long)local_50.mutex));
  }
LAB_005f77a1:
  GridSOA(this_02,patches,(uint)local_48,x0,x1,y0,y1,(uint)patches->grid_u_res,
          (uint)patches->grid_v_res,(SubdivMesh *)(scene->geometries).items[patches->geom].ptr,sVar6
          ,sVar11,bounds_o);
  return this_02;
}

Assistant:

static GridSOA* create(const SubdivPatch1Base* patches, const unsigned time_steps,
                               unsigned x0, unsigned x1, unsigned y0, unsigned y1, 
                               const Scene* scene, Allocator& alloc, BBox3fa* bounds_o = nullptr)
      {
        const unsigned width = x1-x0+1;  
        const unsigned height = y1-y0+1; 
        const GridRange range(0,width-1,0,height-1);
        size_t bvhBytes = 0;
        if (time_steps == 1) 
          bvhBytes = getBVHBytes(range,sizeof(BVH4::AABBNode),0);
        else {
          bvhBytes = (time_steps-1)*getBVHBytes(range,sizeof(BVH4::AABBNodeMB),0);
          bvhBytes += getTemporalBVHBytes(make_range(0,int(time_steps-1)),sizeof(BVH4::AABBNodeMB4D));
        }
        const size_t gridBytes = 4*size_t(width)*size_t(height)*sizeof(float);  
        size_t rootBytes = time_steps*sizeof(BVH4::NodeRef);
#if !defined(__64BIT__)
        rootBytes += 4; // We read 2 elements behind the grid. As we store at least 8 root bytes after the grid we are fine in 64 bit mode. But in 32 bit mode we have to do additional padding.
#endif
        void* data = alloc(offsetof(GridSOA,data)+bvhBytes+time_steps*gridBytes+rootBytes);
        assert(data);
        return new (data) GridSOA(patches,time_steps,x0,x1,y0,y1,patches->grid_u_res,patches->grid_v_res,scene->get<SubdivMesh>(patches->geomID()),bvhBytes,gridBytes,bounds_o);
      }